

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::applyUnknownInvocationToScope(CheckerVisitor *this)

{
  bool bVar1;
  reference ppVar2;
  _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true> *in_RDI;
  FunctionInfo *unaff_retaddr;
  pair<const_char_*const,_SQCompilation::ValueRef_*> *sym;
  iterator __end2;
  iterator __begin2;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *__range2;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *symbols;
  VarScope *s;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_30;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_28;
  TreeOp *local_20;
  TreeOp *local_18;
  FunctionDecl *o;
  _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true> *name;
  
  name = in_RDI;
  for (o = (FunctionDecl *)
           in_RDI[8].
           super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>.
           _M_cur; o != (FunctionDecl *)0x0;
      o = *(FunctionDecl **)&(o->super_Decl).super_Statement.super_Node._coordinates.lineEnd) {
    local_20 = &(o->super_Decl).super_Statement.super_Node._op;
    local_18 = local_20;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                            *)0x196aa0);
      bVar1 = ValueRef::isConstant((ValueRef *)0x196ab3);
      if (!bVar1) {
        if (in_RDI[0x2a].
            super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
            ._M_cur != (__node_type *)0x0) {
          FunctionInfo::addModifiable(unaff_retaddr,(SQChar *)name,o);
        }
        ValueRef::kill(ppVar2->second,4,1);
      }
      std::__detail::
      _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
      operator++(in_RDI);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::applyUnknownInvocationToScope() {
  VarScope *s = currentScope;

  while (s) {
    auto &symbols = s->symbols;
    for (auto &sym : symbols) {
      if (sym.second->isConstant())
        continue;
      if (currentInfo) {
        currentInfo->addModifiable(sym.first, sym.second->info->ownedScope->owner);
      }
      sym.second->kill();
    }
    s = s->parent;
  }
}